

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle_mesh.c
# Opt level: O2

void build_bvh_tree(BVHNode *bvh_root,TriangleMesh *mesh,Centroid *centroids_by_x,
                   Centroid *centroids_by_y,Centroid *centroids_by_z,uint depth,
                   Triangle *new_triangles)

{
  float *pfVar1;
  long lVar2;
  Triangle *pTVar3;
  size_t sVar4;
  int iVar5;
  undefined8 *__ptr;
  void *pvVar6;
  long lVar7;
  void *pvVar8;
  void *pvVar9;
  undefined8 *puVar10;
  undefined8 *puVar11;
  size_t sVar12;
  ulong uVar13;
  long lVar14;
  undefined4 *puVar15;
  undefined4 *puVar16;
  uint uVar17;
  size_t sVar18;
  Centroid *pCVar19;
  size_t *psVar20;
  bool bVar21;
  byte bVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  
  bVar22 = 0;
  __ptr = (undefined8 *)malloc(0x20);
  *__ptr = bvh_root;
  *(undefined4 *)(__ptr + 2) = 0;
  sVar18 = mesh->triangle_count;
  pvVar6 = malloc(sVar18);
  __ptr[1] = pvVar6;
  __ptr[3] = 0;
  for (sVar12 = 0; sVar18 != sVar12; sVar12 = sVar12 + 1) {
    *(undefined1 *)((long)pvVar6 + sVar12) = 1;
  }
  while( true ) {
    if (__ptr == (undefined8 *)0x0) break;
    puVar11 = (undefined8 *)__ptr[3];
    pfVar1 = (float *)*__ptr;
    lVar2 = __ptr[1];
    pfVar1[0] = INFINITY;
    pfVar1[1] = INFINITY;
    pfVar1[2] = INFINITY;
    pfVar1[3] = -INFINITY;
    pfVar1[4] = -INFINITY;
    pfVar1[5] = -INFINITY;
    sVar18 = mesh->triangle_count;
    lVar7 = 0;
    fVar26 = -INFINITY;
    fVar23 = -INFINITY;
    fVar28 = INFINITY;
    fVar25 = INFINITY;
    fVar24 = -INFINITY;
    fVar27 = INFINITY;
    uVar17 = 0;
    for (sVar12 = 0; sVar12 != sVar18; sVar12 = sVar12 + 1) {
      if (*(char *)(lVar2 + sVar12) == '\x01') {
        pTVar3 = mesh->triangles;
        for (lVar14 = 8; lVar14 != 0x2c; lVar14 = lVar14 + 0xc) {
          fVar29 = *(float *)((long)pTVar3->vertices + lVar14 + lVar7 + -8);
          if (fVar29 < fVar28) {
            *pfVar1 = fVar29;
            fVar28 = fVar29;
            fVar29 = *(float *)((long)pTVar3->vertices + lVar14 + lVar7 + -8);
          }
          if (fVar26 < fVar29) {
            pfVar1[3] = fVar29;
            fVar26 = fVar29;
          }
          fVar29 = *(float *)((long)pTVar3->vertices + lVar14 + lVar7 + -4);
          if (fVar29 < fVar27) {
            pfVar1[1] = fVar29;
            fVar27 = fVar29;
            fVar29 = *(float *)((long)pTVar3->vertices + lVar14 + lVar7 + -4);
          }
          if (fVar24 < fVar29) {
            pfVar1[4] = fVar29;
            fVar24 = fVar29;
          }
          fVar29 = *(float *)((long)&pTVar3->vertices[0].x + lVar14 + lVar7);
          if (fVar29 < fVar25) {
            pfVar1[2] = fVar29;
            fVar25 = fVar29;
            fVar29 = *(float *)((long)&pTVar3->vertices[0].x + lVar14 + lVar7);
          }
          if (fVar23 < fVar29) {
            pfVar1[5] = fVar29;
            fVar23 = fVar29;
          }
        }
        uVar17 = uVar17 + 1;
      }
      lVar7 = lVar7 + 0x48;
    }
    *(bool *)(pfVar1 + 6) = (int)uVar17 < 6 || 0x13 < depth;
    if ((int)uVar17 < 6 || 0x13 < depth) {
      *(Triangle **)(pfVar1 + 8) = new_triangles;
      pfVar1[10] = 0.0;
      lVar7 = 0;
      for (uVar13 = 0; uVar13 < mesh->triangle_count; uVar13 = uVar13 + 1) {
        if (*(char *)(lVar2 + uVar13) == '\x01') {
          fVar23 = pfVar1[10];
          pfVar1[10] = (float)((int)fVar23 + 1);
          puVar15 = (undefined4 *)((long)&mesh->triangles->vertices[0].x + lVar7);
          puVar16 = (undefined4 *)((long)(int)fVar23 * 0x48 + *(long *)(pfVar1 + 8));
          for (lVar14 = 0x12; lVar14 != 0; lVar14 = lVar14 + -1) {
            *puVar16 = *puVar15;
            puVar15 = puVar15 + (ulong)bVar22 * -2 + 1;
            puVar16 = puVar16 + (ulong)bVar22 * -2 + 1;
          }
        }
        lVar7 = lVar7 + 0x48;
      }
      new_triangles = new_triangles + (int)pfVar1[10];
    }
    else {
      pCVar19 = centroids_by_x;
      if ((*(uint *)(__ptr + 2) % 3 != 0) &&
         (pCVar19 = centroids_by_z, *(uint *)(__ptr + 2) % 3 != 2)) {
        pCVar19 = centroids_by_y;
      }
      pvVar6 = malloc(sVar18);
      pvVar8 = malloc(sVar18);
      psVar20 = &pCVar19->idx;
      iVar5 = 0;
      while (bVar21 = sVar18 != 0, sVar18 = sVar18 - 1, bVar21) {
        sVar4 = *psVar20;
        *(undefined1 *)((long)pvVar6 + sVar4) = 0;
        *(undefined1 *)((long)pvVar8 + sVar4) = 0;
        if (*(char *)(lVar2 + sVar4) == '\x01') {
          pvVar9 = pvVar8;
          if (iVar5 < (int)(uVar17 >> 1)) {
            pvVar9 = pvVar6;
          }
          *(undefined1 *)(sVar4 + (long)pvVar9) = 1;
          iVar5 = iVar5 + 1;
        }
        psVar20 = psVar20 + 3;
      }
      pvVar9 = malloc(0x30);
      *(void **)(pfVar1 + 8) = pvVar9;
      pvVar9 = malloc(0x30);
      *(void **)(pfVar1 + 10) = pvVar9;
      puVar10 = (undefined8 *)malloc(0x20);
      *puVar10 = pvVar9;
      puVar10[1] = pvVar8;
      *(int *)(puVar10 + 2) = *(int *)(__ptr + 2) + 1;
      puVar10[3] = puVar11;
      puVar11 = (undefined8 *)malloc(0x20);
      *puVar11 = *(undefined8 *)(pfVar1 + 8);
      puVar11[1] = pvVar6;
      *(int *)(puVar11 + 2) = *(int *)(__ptr + 2) + 1;
      puVar11[3] = puVar10;
    }
    free((void *)__ptr[1]);
    free(__ptr);
    __ptr = puVar11;
  }
  return;
}

Assistant:

void build_bvh_tree(BVHNode* bvh_root, TriangleMesh* mesh,
                    Centroid* centroids_by_x, Centroid* centroids_by_y, Centroid* centroids_by_z,
                    unsigned int depth, Triangle* new_triangles) {
    BVHBuildStackNode* stack_head = malloc(sizeof(BVHBuildStackNode));

    stack_head->bvh_node = bvh_root;
    stack_head->depth = 0;
    stack_head->indices = malloc(sizeof(bool) * mesh->triangle_count);
    stack_head->prev = NULL;

    for (size_t i = 0; i < mesh->triangle_count; i++) {
        stack_head->indices[i] = true;
    }

    while (stack_head) {
        // pop topmost node
        BVHBuildStackNode* current = stack_head;
        stack_head = stack_head->prev;

        BVHNode* node = current->bvh_node;
        bool* indices = current->indices;

        // compute bounding box for current node
        node->vmin.x = INFINITY;
        node->vmin.y = INFINITY;
        node->vmin.z = INFINITY;

        node->vmax.x = -INFINITY;
        node->vmax.y = -INFINITY;
        node->vmax.z = -INFINITY;
        
        int triangle_count = 0;

        for (size_t i = 0; i < mesh->triangle_count; i++) {
            if (indices[i]) {
                for (int j = 0; j < 3; j++) {
                    if (mesh->triangles[i].vertices[j].x < node->vmin.x) {
                        node->vmin.x = mesh->triangles[i].vertices[j].x;
                    }
                    if (mesh->triangles[i].vertices[j].x > node->vmax.x) {
                        node->vmax.x = mesh->triangles[i].vertices[j].x;
                    }

                    if (mesh->triangles[i].vertices[j].y < node->vmin.y) {
                        node->vmin.y = mesh->triangles[i].vertices[j].y;
                    }
                    if (mesh->triangles[i].vertices[j].y > node->vmax.y) {
                        node->vmax.y = mesh->triangles[i].vertices[j].y;
                    }

                    if (mesh->triangles[i].vertices[j].z < node->vmin.z) {
                        node->vmin.z = mesh->triangles[i].vertices[j].z;
                    }
                    if (mesh->triangles[i].vertices[j].z > node->vmax.z) {
                        node->vmax.z = mesh->triangles[i].vertices[j].z;
                    }
                }
                triangle_count++;
            }
        }
        
        node->isLeaf = (triangle_count <= 5 || depth >= 20);
        if (node->isLeaf) {
            // base case : store new triangles in the right place in the reordered triangle array
            node->data.triangles.array = new_triangles;
            node->data.triangles.count = 0;
            for (size_t i = 0; i < mesh->triangle_count; i++) {
                if (indices[i]) {
                    node->data.triangles.array[node->data.triangles.count++] = mesh->triangles[i];
                }
            }
            new_triangles += node->data.triangles.count;
        } else {
            Centroid* centroids_by_split_axis = NULL;
            int split_axis = current->depth % 3;
            switch (split_axis) {
            case 0:
                centroids_by_split_axis = centroids_by_x;
                break;
            case 1:
                centroids_by_split_axis = centroids_by_y;
                break;
            case 2:
                centroids_by_split_axis = centroids_by_z;
                break;
            }

            bool* l_indices = malloc(sizeof(bool) * mesh->triangle_count);
            bool* r_indices = malloc(sizeof(bool) * mesh->triangle_count);

            int triangles_seen = 0;
            for (size_t i = 0; i < mesh->triangle_count; i++) {
                size_t idx = centroids_by_split_axis[i].idx;
                l_indices[idx] = false;
                r_indices[idx] = false;
                if (indices[idx]) {
                    if (triangles_seen < triangle_count / 2) {
                        l_indices[idx] = true;
                    } else {
                        r_indices[idx] = true;
                    }
                    triangles_seen++;
                }
            }

            node->data.children.left = malloc(sizeof(BVHNode));
            node->data.children.right = malloc(sizeof(BVHNode));
            
            // push right child on stack
            BVHBuildStackNode* new_stack_element = malloc(sizeof(BVHBuildStackNode));
            new_stack_element->bvh_node = node->data.children.right;
            new_stack_element->indices = r_indices;
            new_stack_element->depth = current->depth + 1;
            
            new_stack_element->prev = stack_head;
            stack_head = new_stack_element;

            // push left child on stack
            new_stack_element = malloc(sizeof(BVHBuildStackNode));
            new_stack_element->bvh_node = node->data.children.left;
            new_stack_element->indices = l_indices;
            new_stack_element->depth = current->depth + 1;
            
            new_stack_element->prev = stack_head;
            stack_head = new_stack_element;
        }
        // cleanup
        free(current->indices);
        free(current);
    }
}